

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screena.cpp
# Opt level: O3

void robot_stat(int n)

{
  ulong uVar1;
  undefined8 uVar2;
  
  uVar1 = (ulong)(uint)n;
  if (robots[n].last_damage != robots[n].damage) {
    robots[n].last_damage = robots[n].damage;
    uVar2 = 0x42;
    if (col_1 == '\0') {
      uVar2 = 0;
    }
    printf("\x1b[%d;%dH",uVar1 * 5 + 2 & 0xffffffff,uVar2);
    printf("%03d",(ulong)(uint)robots[n].last_damage);
  }
  if (robots[n].last_scan != robots[n].scan) {
    robots[n].last_scan = robots[n].scan;
    uVar2 = 0x4b;
    if (col_2 == '\0') {
      uVar2 = 0;
    }
    printf("\x1b[%d;%dH",uVar1 * 5 + 2 & 0xffffffff,uVar2);
    printf("%03d",(ulong)(uint)robots[n].last_scan);
  }
  if (robots[n].last_speed != robots[n].speed) {
    robots[n].last_speed = robots[n].speed;
    uVar2 = 0x42;
    if (col_1 == '\0') {
      uVar2 = 0;
    }
    printf("\x1b[%d;%dH",uVar1 * 5 + 3 & 0xffffffff,uVar2);
    printf("%03d",(ulong)(uint)robots[n].speed);
  }
  if (robots[n].last_heading == robots[n].heading) {
    return;
  }
  robots[n].last_heading = robots[n].heading;
  uVar2 = 0x4b;
  if (col_2 == '\0') {
    uVar2 = 0;
  }
  printf("\x1b[%d;%dH",uVar1 * 5 + 3 & 0xffffffff,uVar2);
  printf("%03d",(ulong)(uint)robots[n].heading);
  return;
}

Assistant:

void robot_stat(int n)
{
  int changed = 0;

  if (robots[n].last_damage != robots[n].damage) {
    robots[n].last_damage = robots[n].damage;
    move(5*n+2,col_1);
    printw("%03d",robots[n].last_damage);
    changed = 1;
  }
  if (robots[n].last_scan != robots[n].scan) {
    robots[n].last_scan = robots[n].scan;
    move(5*n+2,col_2);
    printw("%03d",robots[n].last_scan);
    changed = 1;
  }
  if (robots[n].last_speed != robots[n].speed) {
    robots[n].last_speed = robots[n].speed;
    move(5*n+3,col_1);
    printw("%03d",robots[n].speed);
    changed = 1;
  }
  if (robots[n].last_heading != robots[n].heading) {
    robots[n].last_heading = robots[n].heading;
    move(5*n+3,col_2);
    printw("%03d",robots[n].heading);
    changed = 1;
  }

/*
  move(5*n+4,col_1);
  printw("%3d",robots[n].x / CLICK);
  move(5*n+4,col_2);
  printw("%3d",robots[n].y / CLICK);
*/

  if (changed)
    refresh();
}